

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

lys_module *
lyp_search_file(ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
               unres_schema *unres)

{
  char cVar1;
  char **ppcVar2;
  lys_module **pplVar3;
  int iVar4;
  uint uVar5;
  ly_set *set;
  size_t sVar6;
  lys_node *__name;
  DIR *__dirp;
  size_t sVar7;
  dirent *pdVar8;
  size_t sVar9;
  char *pcVar10;
  lys_module *plVar11;
  LY_ERR *pLVar12;
  int *piVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  LYS_INFORMAT LVar19;
  LYS_INFORMAT format;
  long lVar20;
  ulong uVar21;
  undefined1 local_130 [8];
  stat st;
  long local_90;
  char *local_48;
  char *wn;
  char *local_38;
  
  local_48 = (char *)0x0;
  st.__glibc_reserved[2] = (__syscall_slong_t)unres;
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
    return (lys_module *)0x0;
  }
  sVar6 = strlen(name);
  __name = (lys_node *)get_current_dir_name();
  if (__name == (lys_node *)0x0) {
LAB_00122be0:
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_EMEM;
    __name = (lys_node *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
LAB_00122c08:
    __dirp = (DIR *)0x0;
  }
  else {
    iVar4 = ly_set_add(set,__name,0);
    if (iVar4 == -1) goto LAB_00122c08;
    ppcVar2 = (ctx->models).search_paths;
    if ((ppcVar2 != (char **)0x0) && (pcVar16 = *ppcVar2, pcVar16 != (char *)0x0)) {
      lVar20 = 8;
      do {
        __name = (lys_node *)strdup(pcVar16);
        if (__name == (lys_node *)0x0) goto LAB_00122be0;
        iVar4 = ly_set_add(set,__name,0);
        if (iVar4 == -1) goto LAB_00122c08;
        pcVar16 = *(char **)((long)(ctx->models).search_paths + lVar20);
        lVar20 = lVar20 + 8;
      } while (pcVar16 != (char *)0x0);
    }
    if (set->number == 0) {
      __dirp = (DIR *)0x0;
      __name = (lys_node *)0x0;
    }
    else {
      lVar20 = sVar6 + 1;
      format = LYS_IN_UNKNOWN;
      local_90 = 0;
      __dirp = (DIR *)0x0;
      __name = (lys_node *)0x0;
      pcVar16 = (char *)0x0;
      do {
        free(__name);
        free(local_48);
        local_48 = (char *)0x0;
        uVar5 = set->number - 1;
        set->number = uVar5;
        __name = (set->set).s[uVar5];
        wn = (char *)0x0;
        (set->set).s[uVar5] = (lys_node *)0x0;
        if ('\x01' < ly_log_level) {
          ly_log(LY_LLVRB,"Searching for \"%s\" in %s.",name,__name);
        }
        if (__dirp != (DIR *)0x0) {
          closedir(__dirp);
        }
        __dirp = opendir((char *)__name);
        sVar7 = strlen((char *)__name);
        local_38 = pcVar16;
        if (__dirp == (DIR *)0x0) {
          if ('\0' < ly_log_level) {
            piVar13 = __errno_location();
            pcVar16 = strerror(*piVar13);
            ly_log(LY_LLWRN,"Unable to open directory \"%s\" for searching (sub)modules (%s).",
                   __name,pcVar16);
          }
        }
        else {
          pdVar8 = readdir(__dirp);
          if (pdVar8 != (dirent *)0x0) {
            LVar19 = format;
            do {
              if ((byte)pdVar8->d_name[0] == 0x2e) {
                if (pdVar8->d_name[1] != '\0') {
                  uVar5 = (byte)pdVar8->d_name[1] - 0x2e;
                  if (uVar5 == 0) {
                    uVar5 = (uint)(byte)pdVar8->d_name[2];
                  }
                  iVar4 = -uVar5;
                  goto LAB_0012281f;
                }
              }
              else {
                iVar4 = 0x2e - (uint)(byte)pdVar8->d_name[0];
LAB_0012281f:
                if (iVar4 != 0) {
                  pcVar16 = pdVar8->d_name;
                  free(local_48);
                  iVar4 = asprintf(&local_48,"%s/%s",__name,pcVar16);
                  if (iVar4 == -1) {
                    pLVar12 = ly_errno_location();
                    *pLVar12 = LY_EMEM;
                    wn = (char *)0x0;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
                    pcVar16 = local_38;
                    goto LAB_00122c13;
                  }
                  iVar4 = stat(local_48,(stat *)local_130);
                  if (iVar4 == -1) {
                    if ('\0' < ly_log_level) {
                      piVar13 = __errno_location();
                      pcVar10 = strerror(*piVar13);
                      ly_log(LY_LLWRN,
                             "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                             ,pcVar16,__name,pcVar10);
                    }
                  }
                  else if (((uint)st.st_nlink & 0xf000) == 0x8000) {
                    iVar4 = strncmp(name,pcVar16,sVar6);
                    if ((iVar4 == 0) && ((cVar1 = pcVar16[sVar6], cVar1 == '@' || (cVar1 == '.'))))
                    {
                      sVar9 = strlen(pcVar16);
                      iVar4 = strcmp(pcVar16 + (sVar9 - 4),".yin");
                      if (iVar4 == 0) {
                        format = LYS_IN_YIN;
                      }
                      else {
                        iVar4 = strcmp(pcVar16 + (sVar9 - 5),".yang");
                        if (iVar4 != 0) goto LAB_00122903;
                        format = LYS_IN_YANG;
                      }
                      if (revision == (char *)0x0) {
                        if (local_38 == (char *)0x0) {
LAB_00122a20:
                          local_38 = local_48;
                          local_48 = (char *)0x0;
                          LVar19 = format;
                          local_90 = sVar7 + lVar20;
                        }
                        else if (cVar1 == '@') {
                          iVar4 = lyp_check_date(pcVar16 + lVar20);
                          if ((iVar4 == 0) &&
                             ((local_38[local_90] != '@' ||
                              (iVar4 = strncmp(local_38 + local_90 + 1,pcVar16 + lVar20,10),
                              iVar4 < 0)))) {
                            free(local_38);
                            goto LAB_00122a20;
                          }
                        }
                      }
                      else if (cVar1 == '@') {
                        sVar9 = strlen(revision);
                        iVar4 = strncmp(revision,pcVar16 + lVar20,sVar9);
                        if (iVar4 == 0) {
                          free(local_38);
                          pcVar16 = local_48;
                          local_48 = (char *)0x0;
                          goto LAB_00122ab1;
                        }
                      }
                      else {
                        free(local_38);
                        local_38 = local_48;
                        local_48 = (char *)0x0;
                        LVar19 = format;
                        local_90 = sVar7 + lVar20;
                      }
                    }
                  }
                  else if ((((uint)st.st_nlink & 0xf000) == 0x4000) && (set->number != 0)) {
                    iVar4 = ly_set_add(set,local_48,0);
                    pcVar16 = local_38;
                    if (iVar4 == -1) goto LAB_00122c13;
                    local_48 = (char *)0x0;
                  }
                }
              }
LAB_00122903:
              pdVar8 = readdir(__dirp);
              format = LVar19;
            } while (pdVar8 != (dirent *)0x0);
          }
        }
        pcVar16 = local_38;
      } while (set->number != 0);
      if (local_38 != (char *)0x0) {
LAB_00122ab1:
        if ('\x01' < ly_log_level) {
          ly_log(LY_LLVRB,"Loading schema from \"%s\" file.",pcVar16);
        }
        local_38 = pcVar16;
        pcVar10 = strrchr(pcVar16,0x2e);
        pcVar10[1] = '\0';
        if ((revision == (char *)0x0) && (lVar20 = (long)(ctx->models).used, 0 < lVar20)) {
          pplVar3 = (ctx->models).list;
          lVar18 = 0;
          do {
            plVar11 = pplVar3[lVar18];
            pcVar16 = plVar11->filepath;
            if ((pcVar16 != (char *)0x0) &&
               (wn = (char *)plVar11, iVar4 = strcmp(name,plVar11->name), iVar4 == 0)) {
              sVar6 = strlen(local_38);
              iVar4 = strncmp(local_38,pcVar16,sVar6);
              pcVar16 = local_38;
              pcVar17 = wn;
              if (iVar4 == 0) {
                if ((implement == 0) || (wn[0x40] < '\0')) {
                  wn = pcVar17;
                  if ((wn[0x40] & 0x40U) != 0) {
                    lys_set_enabled((lys_module *)wn);
                  }
                }
                else {
                  iVar4 = lys_set_implemented((lys_module *)wn);
                  pcVar16 = local_38;
                  wn = pcVar17;
                  if (iVar4 != 0) {
                    wn = (char *)0x0;
                  }
                }
                goto LAB_00122c13;
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar20 != lVar18);
        }
        pcVar16 = local_38;
        pcVar10[1] = 'y';
        iVar4 = open(local_38,0);
        if (iVar4 < 0) {
          pLVar12 = ly_errno_location();
          *pLVar12 = LY_ESYS;
          piVar13 = __errno_location();
          pcVar10 = strerror(*piVar13);
          wn = (char *)0x0;
          ly_log(LY_LLERR,"Unable to open data model file \"%s\" (%s).",pcVar16,pcVar10);
          goto LAB_00122c13;
        }
        if (module == (lys_module *)0x0) {
          plVar11 = lys_read_import(ctx,iVar4,format,revision,implement);
        }
        else {
          plVar11 = (lys_module *)
                    lys_sub_parse_fd(module,iVar4,format,(unres_schema *)st.__glibc_reserved[2]);
        }
        close(iVar4);
        if (plVar11 == (lys_module *)0x0) {
          wn = (char *)0x0;
          goto LAB_00122c13;
        }
        pcVar14 = strrchr(pcVar16,0x2f);
        pcVar17 = pcVar14 + 1;
        if (pcVar14 == (char *)0x0) {
          pcVar17 = pcVar16;
        }
        pcVar14 = strchr(pcVar17,0x40);
        pcVar16 = plVar11->name;
        wn = (char *)plVar11;
        sVar6 = strlen(pcVar16);
        iVar4 = strncmp(pcVar17,pcVar16,sVar6);
        if (iVar4 == 0) {
          pcVar15 = pcVar14;
          if (pcVar14 == (char *)0x0) {
            pcVar15 = pcVar10;
          }
          if (pcVar17 + sVar6 != pcVar15) goto LAB_00122ddc;
        }
        else {
LAB_00122ddc:
          if ('\0' < ly_log_level) {
            ly_log(LY_LLWRN,"File name \"%s\" does not match module name \"%s\".",pcVar17,pcVar16);
          }
        }
        pcVar16 = local_38;
        if (((pcVar14 != (char *)0x0) &&
            (((cVar1 = wn[0x41], cVar1 == '\0' || ((long)pcVar10 - (long)(pcVar14 + 1) != 10)) ||
             (iVar4 = strncmp(*(char **)(wn + 0x50),pcVar14 + 1,10), iVar4 != 0)))) &&
           ('\0' < ly_log_level)) {
          if (cVar1 == '\0') {
            pcVar10 = "none";
          }
          else {
            pcVar10 = *(char **)(wn + 0x50);
          }
          ly_log(LY_LLWRN,"File name \"%s\" does not match module revision \"%s\".",pcVar17,pcVar10)
          ;
        }
        pcVar16 = lydict_insert_zc(ctx,pcVar16);
        *(char **)(wn + 0x38) = pcVar16;
        pcVar16 = (char *)0x0;
        goto LAB_00122c13;
      }
    }
    if (module == (lys_module *)0x0 && revision == (char *)0x0) {
      wn = (char *)ly_ctx_get_module(ctx,name,(char *)0x0);
      pcVar16 = (char *)0x0;
      if ((lys_module *)wn != (lys_module *)0x0) goto LAB_00122c13;
    }
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_ESYS;
    ly_log(LY_LLERR,"Data model \"%s\" not found.",name);
  }
  wn = (char *)0x0;
  pcVar16 = (char *)0x0;
LAB_00122c13:
  free(local_48);
  free(__name);
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  free(pcVar16);
  if (set->number != 0) {
    uVar21 = 0;
    do {
      free((set->set).s[uVar21]);
      uVar21 = uVar21 + 1;
    } while (uVar21 < set->number);
  }
  ly_set_free(set);
  return (lys_module *)wn;
}

Assistant:

struct lys_module *
lyp_search_file(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                int implement, struct unres_schema *unres)
{
    size_t len, flen, match_len = 0, dir_len;
    int fd, i;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL, *dot, *rev, *filename;
    LYS_INFORMAT format, match_format = 0;
    struct lys_module *result = NULL;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM;
        return NULL;
    }

    len = strlen(name);
    wd = get_current_dir_name();
    if (!wd) {
        LOGMEM;
        goto cleanup;
    } else if (ly_set_add(dirs, wd, 0) == -1) {
        goto cleanup;
    }
    if (ctx->models.search_paths) {
        for (i = 0; ctx->models.search_paths[i]; i++) {
            wd = strdup(ctx->models.search_paths[i]);
            if (!wd) {
                LOGMEM;
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN("Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM;
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN("Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && dirs->number) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format;
                            goto matched;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(&file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format;
                    continue;
                }
            }
        }
    }

    if (!match_name) {
        if (!module && !revision) {
            /* otherwise the module would be already taken from the context */
            result = (struct lys_module *)ly_ctx_get_module(ctx, name, revision);
        }
        if (!result) {
            LOGERR(LY_ESYS, "Data model \"%s\" not found.", name);
        }
        goto cleanup;
    }

matched:
    LOGVRB("Loading schema from \"%s\" file.", match_name);

    /* cut the format for now */
    dot = strrchr(match_name, '.');
    dot[1] = '\0';

    /* check that the same file was not already loaded - it make sense only in case of loading the newest revision,
     * search also in disabled module - if the matching module is disabled, it will be enabled instead of loading it */
    if (!revision) {
        for (i = 0; i < ctx->models.used; ++i) {
            if (ctx->models.list[i]->filepath && !strcmp(name, ctx->models.list[i]->name)
                    && !strncmp(match_name, ctx->models.list[i]->filepath, strlen(match_name))) {
                result = ctx->models.list[i];
                if (implement && !result->implemented) {
                    /* make it implemented now */
                    if (lys_set_implemented(result)) {
                        result = NULL;
                    }
                } else if (result->disabled) {
                    lys_set_enabled(result);
                }

                goto cleanup;
            }
        }
    }

    /* add the format back */
    dot[1] = 'y';

    /* open the file */
    fd = open(match_name, O_RDONLY);
    if (fd < 0) {
        LOGERR(LY_ESYS, "Unable to open data model file \"%s\" (%s).",
               match_name, strerror(errno));
        goto cleanup;
    }

    if (module) {
        result = (struct lys_module *)lys_sub_parse_fd(module, fd, match_format, unres);
    } else {
        result = lys_read_import(ctx, fd, match_format, revision, implement);
    }
    close(fd);

    if (!result) {
        goto cleanup;
    }

    /* check that name and revision match filename */
    filename = strrchr(match_name, '/');
    if (!filename) {
        filename = match_name;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    /* name */
    len = strlen(result->name);
    if (strncmp(filename, result->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN("File name \"%s\" does not match module name \"%s\".", filename, result->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!result->rev_size || len != 10 || strncmp(result->rev[0].date, rev, len)) {
            LOGWRN("File name \"%s\" does not match module revision \"%s\".", filename,
                   result->rev_size ? result->rev[0].date : "none");
        }
    }

    result->filepath = lydict_insert_zc(ctx, match_name);
    match_name = NULL;
    /* success */

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return result;
}